

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * exprTableRegister(Parse *pParse,Table *pTab,int regBase,i16 iCol)

{
  sqlite3 *db;
  Column *pCVar1;
  Expr *pExpr;
  char *zC;
  Token local_38;
  
  db = pParse->db;
  local_38.z = (char *)0x0;
  local_38.n = 0;
  pExpr = sqlite3ExprAlloc(db,0xa8,&local_38,0);
  if (pExpr == (Expr *)0x0) {
    pExpr = (Expr *)0x0;
  }
  else if ((iCol < 0) || (pTab->iPKey == iCol)) {
    pExpr->iTable = regBase;
    pExpr->affinity = 'D';
  }
  else {
    pCVar1 = pTab->aCol;
    pExpr->iTable = iCol + regBase + 1;
    pExpr->affinity = pCVar1[(ushort)iCol].affinity;
    zC = pCVar1[(ushort)iCol].zColl;
    if (zC == (char *)0x0) {
      zC = db->pDfltColl->zName;
    }
    pExpr = sqlite3ExprAddCollateString(pParse,pExpr,zC);
  }
  return pExpr;
}

Assistant:

static Expr *exprTableRegister(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* The table whose content is at r[regBase]... */
  int regBase,       /* Contents of table pTab */
  i16 iCol           /* Which column of pTab is desired */
){
  Expr *pExpr;
  Column *pCol;
  const char *zColl;
  sqlite3 *db = pParse->db;

  pExpr = sqlite3Expr(db, TK_REGISTER, 0);
  if( pExpr ){
    if( iCol>=0 && iCol!=pTab->iPKey ){
      pCol = &pTab->aCol[iCol];
      pExpr->iTable = regBase + iCol + 1;
      pExpr->affinity = pCol->affinity;
      zColl = pCol->zColl;
      if( zColl==0 ) zColl = db->pDfltColl->zName;
      pExpr = sqlite3ExprAddCollateString(pParse, pExpr, zColl);
    }else{
      pExpr->iTable = regBase;
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }
  }
  return pExpr;
}